

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocTestApprovals.h
# Opt level: O2

void __thiscall
ApprovalTests::anon_unknown_1::DocTestApprovalListener::test_case_start
          (DocTestApprovalListener *this,TestCaseData *testInfo)

{
  String *string;
  TestName *this_00;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  string local_38;
  
  this_00 = &this->currentTest;
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const*const&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             &testInfo->m_name);
  (anonymous_namespace)::DocTestApprovalListener::doctestToString_abi_cxx11_
            (&local_38,testInfo,string);
  TestName::setFileName(this_00,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  FrameworkIntegrations::setCurrentTest(this_00);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/doctest/DocTestApprovals.h:115:21)>
             ::_M_invoke;
  local_48 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/doctest/DocTestApprovals.h:115:21)>
             ::_M_manager;
  FrameworkIntegrations::setTestPassedNotification((TestPassedNotification *)&local_58);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
  return;
}

Assistant:

void test_case_start(const doctest::TestCaseData& testInfo) override
            {
                currentTest.sections.emplace_back(testInfo.m_name);
                currentTest.setFileName(doctestToString(testInfo.m_file));
                ApprovalTests::FrameworkIntegrations::setCurrentTest(&currentTest);
                ApprovalTests::FrameworkIntegrations::setTestPassedNotification(
                    []() { REQUIRE(true); });
            }